

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void movingAtomListProcessing(atom *initAtomLst,void *userdata)

{
  residue_t *prVar1;
  int iVar2;
  int iVar3;
  atom *paVar4;
  int rescnt;
  atom *atomlist;
  char prevChain [5];
  char local_e6;
  char local_e5 [5];
  atom_t *local_e0;
  chainEndData_t local_d8;
  
  rescnt = 0;
  memset(&local_d8,0,0xa4);
  local_e5[0] = '?';
  local_e5[1] = '?';
  local_e5[2] = 0;
  if (initAtomLst == (atom *)0x0) {
    atomlist = (atom *)0x0;
  }
  else {
    local_e6 = ' ';
    rescnt = 0;
    iVar3 = 0;
    paVar4 = (atom *)0x0;
    do {
      atomlist = initAtomLst;
      initAtomLst = atomlist->next;
      prVar1 = atomlist->r;
      atomlist->next = paVar4;
      if (((prVar1->resid != iVar3) || (prVar1->resInsCode != local_e6)) ||
         (iVar2 = strcmp(prVar1->chain,local_e5), iVar2 != 0)) {
        local_e0 = initAtomLst;
        if (rescnt != 0) {
          hisNHcheck(&local_d8,atomlist,rescnt);
        }
        iVar3 = strcmp(atomlist->r->chain,local_e5);
        CtermCheck(&local_d8,rescnt,(uint)(iVar3 != 0));
        rescnt = rescnt + 1;
        prVar1 = atomlist->r;
        iVar3 = strcmp(prVar1->chain,local_e5);
        local_d8.ambigN[4] = (atom *)0x0;
        local_d8.ambigN[5] = (atom *)0x0;
        local_d8.ambigN[6] = (atom *)0x0;
        local_d8.ambigN[7] = (atom *)0x0;
        local_d8.ambigO[0] = (atom *)0x0;
        local_d8.ambigO[1] = (atom *)0x0;
        local_d8.ambigO[2] = (atom *)0x0;
        local_d8.ambigO[3] = (atom *)0x0;
        local_d8.ambigO[4] = (atom *)0x0;
        local_d8.ambigO[5] = (atom *)0x0;
        local_d8.ambigO[6] = (atom *)0x0;
        local_d8.ambigO[7] = (atom *)0x0;
        local_d8.res_mc_oxy_cnt = 0;
        if (iVar3 != 0) {
          local_d8.first = rescnt;
        }
        iVar3 = prVar1->resid;
        local_e6 = prVar1->resInsCode;
        strcpy(local_e5,prVar1->chain);
        initAtomLst = local_e0;
      }
      atomlist->r->rescnt = rescnt;
      ProcessResInfo(&local_d8,atomlist);
      paVar4 = atomlist;
    } while (initAtomLst != (atom_t *)0x0);
  }
  if (rescnt != 0) {
    hisNHcheck(&local_d8,atomlist,rescnt);
  }
  CtermCheck(&local_d8,rescnt,1);
  return;
}

Assistant:

void movingAtomListProcessing(atom *initAtomLst, void *userdata)
{
   int previd = 0, rescnt = 0;
   char prevInsCode = ' ';
   char prevChain[5];
   atom *a = NULL, *prevAtomLst = NULL, *nexta = NULL;
   chainEndData_t endData;

   initEndData(&endData);

   prevChain[0] = prevChain[1] = '?';
   prevChain[2] = '\0';

   for(a=initAtomLst; a; a = nexta) {
      nexta = a->next;

      a->next = prevAtomLst; /* remove a from initial atom list */
      prevAtomLst = a;       /* and build up a reversed list of */
                             /* only atoms previously seen      */

      if (a->r->resid != previd || a->r->resInsCode != prevInsCode
                             || strcmp(a->r->chain, prevChain) != 0) {

	 if (rescnt){
	    resCheck(&endData, prevAtomLst, rescnt);
	 }
	 CtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));

	 ++rescnt;

	 NtermCheck(&endData, rescnt, (strcmp(a->r->chain, prevChain) != 0));
	 previd = a->r->resid;
	 prevInsCode = a->r->resInsCode;
	 strcpy(prevChain, a->r->chain);
         //prevChain[2] = '\0';
      }
      a->r->rescnt = rescnt;

      ProcessResInfo(&endData, a);
   }

   if (rescnt) { resCheck(&endData, prevAtomLst, rescnt); }
   CtermCheck(&endData, rescnt, TRUE);
}